

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lemon.c
# Opt level: O3

plink * Plink_new(void)

{
  char cVar1;
  undefined1 auVar2 [16];
  char *__s;
  plink *ppVar3;
  plink *ppVar4;
  char *pcVar5;
  size_t sVar6;
  size_t sVar7;
  char *pcVar8;
  plink *ppVar9;
  FILE *pFVar10;
  char *__modes;
  char *pcVar11;
  char *suffix;
  long lVar12;
  lemon *lemp;
  int iVar13;
  undefined1 auVar14 [16];
  long lVar15;
  
  ppVar4 = plink_freelist;
  if (plink_freelist == (plink *)0x0) {
    lVar12 = 100;
    pcVar11 = (char *)0x10;
    ppVar4 = (plink *)calloc(100,0x10);
    auVar2 = _DAT_0010d020;
    if (ppVar4 == (plink *)0x0) {
      plink_freelist = ppVar4;
      Plink_new_cold_1();
      __s = outputDir;
      pcVar8 = *(char **)(lVar12 + 0xe0);
      suffix = pcVar11;
      if (outputDir != (char *)0x0) {
        suffix = (char *)0x2f;
        pcVar5 = strrchr(pcVar8,0x2f);
        if (pcVar5 != (char *)0x0) {
          pcVar8 = pcVar5 + 1;
        }
      }
      sVar6 = strlen(pcVar8);
      sVar7 = strlen(pcVar11);
      iVar13 = (int)sVar7 + (int)sVar6;
      if (__s != (char *)0x0) {
        sVar6 = strlen(__s);
        iVar13 = iVar13 + (int)sVar6 + 1;
      }
      lemp = (lemon *)(long)(iVar13 + 5);
      ppVar4 = (plink *)malloc((size_t)lemp);
      if (ppVar4 != (plink *)0x0) {
        *(char *)&ppVar4->cfp = '\0';
        ppVar3 = ppVar4;
        if (__s != (char *)0x0) {
          lVar12 = 0;
          do {
            cVar1 = __s[lVar12];
            *(char *)((long)&ppVar4->cfp + lVar12) = cVar1;
            lVar12 = lVar12 + 1;
          } while (cVar1 != '\0');
          do {
            ppVar9 = ppVar3;
            ppVar3 = (plink *)((long)&ppVar9->cfp + 1);
          } while (*(char *)&ppVar9->cfp != '\0');
          *(undefined2 *)&ppVar9->cfp = 0x2f;
          ppVar3 = ppVar4;
        }
        do {
          ppVar9 = ppVar3;
          ppVar3 = (plink *)((long)&ppVar9->cfp + 1);
        } while (*(char *)&ppVar9->cfp != '\0');
        lVar12 = 0;
        do {
          cVar1 = pcVar8[lVar12];
          *(char *)((long)&ppVar9->cfp + lVar12) = cVar1;
          lVar12 = lVar12 + 1;
        } while (cVar1 != '\0');
        pcVar8 = strrchr((char *)ppVar4,0x2e);
        ppVar3 = ppVar4;
        if (pcVar8 != (char *)0x0) {
          *pcVar8 = '\0';
        }
        do {
          ppVar9 = ppVar3;
          ppVar3 = (plink *)((long)&ppVar9->cfp + 1);
        } while (*(char *)&ppVar9->cfp != '\0');
        lVar12 = 0;
        do {
          cVar1 = pcVar11[lVar12];
          *(char *)((long)&ppVar9->cfp + lVar12) = cVar1;
          lVar12 = lVar12 + 1;
        } while (cVar1 != '\0');
        return ppVar4;
      }
      file_makename_cold_1();
      if (lemp->outname != (char *)0x0) {
        free(lemp->outname);
      }
      pcVar11 = file_makename(lemp,suffix);
      lemp->outname = pcVar11;
      pFVar10 = fopen(pcVar11,__modes);
      if ((pFVar10 == (FILE *)0x0) && (*__modes == 'w')) {
        file_open_cold_1();
      }
      return (plink *)pFVar10;
    }
    lVar12 = 0x18;
    auVar14 = _DAT_0010d010;
    do {
      lVar15 = auVar14._8_8_;
      if (SUB164(auVar14 ^ auVar2,4) == -0x80000000 && SUB164(auVar14 ^ auVar2,0) < -0x7fffff9d) {
        *(plink **)((long)&ppVar4[-1].cfp + lVar12) = ppVar4 + auVar14._0_8_ + 1;
        *(plink **)((long)&ppVar4->cfp + lVar12) = ppVar4 + lVar15 + 1;
      }
      auVar14._0_8_ = auVar14._0_8_ + 2;
      auVar14._8_8_ = lVar15 + 2;
      lVar12 = lVar12 + 0x20;
    } while (lVar12 != 0x658);
    ppVar4[99].next = (plink *)0x0;
  }
  plink_freelist = ppVar4->next;
  return ppVar4;
}

Assistant:

struct plink *Plink_new(void){
  struct plink *newlink;

  if( plink_freelist==0 ){
    int i;
    int amt = 100;
    plink_freelist = (struct plink *)calloc( amt, sizeof(struct plink) );
    if( plink_freelist==0 ){
      fprintf(stderr,
      "Unable to allocate memory for a new follow-set propagation link.\n");
      exit(1);
    }
    for(i=0; i<amt-1; i++) plink_freelist[i].next = &plink_freelist[i+1];
    plink_freelist[amt-1].next = 0;
  }
  newlink = plink_freelist;
  plink_freelist = plink_freelist->next;
  return newlink;
}